

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O1

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)2>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  __int_type _Var1;
  uintptr_t uVar2;
  PinResult PVar3;
  LfQueueControl *pLVar4;
  LfQueueControl *i_tail;
  char cVar5;
  ulong uVar6;
  LfQueueControl *pLVar7;
  ulong uVar8;
  ulong *i_address;
  ulong uVar9;
  bool bVar10;
  PinGuard<density_tests::UnmovableFastTestAllocator<65536UL>,_(density::progress_guarantee)2>
  scoped_pin;
  PinGuard<density_tests::UnmovableFastTestAllocator<65536UL>,_(density::progress_guarantee)2>
  local_68;
  long local_58;
  ulong local_50;
  ulong local_48;
  uintptr_t local_40;
  ulong local_38;
  
  local_40 = i_control_bits;
  if (7 < i_control_bits) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x80);
  }
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x81);
  }
  uVar8 = 8;
  if (8 < i_alignment) {
    uVar8 = i_alignment;
  }
  uVar9 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    uVar9 = i_size;
  }
  uVar9 = uVar9 + uVar8 + (ulong)i_include_type * 8 + 0x3f;
  local_68.m_pinned_page = (void *)0x0;
  local_68.m_allocator = (UnmovableFastTestAllocator<65536UL> *)this;
  if (uVar9 < 0x1000) {
    local_38 = uVar9 >> 6;
    i_tail = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    uVar6 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
    uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
    local_48 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    local_58 = (ulong)i_include_type * 8 + uVar8 + 7;
    local_50 = -uVar8;
    do {
      if (((ulong)i_tail & 0x3f) == 0) {
        _Var1 = (long)&i_tail->m_next + (ulong)((uint)uVar9 & 0xfc0);
        if (_Var1 - ((ulong)i_tail & 0xffffffffffff0000) < 0xffc1) {
          LOCK();
          pLVar4 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar10 = i_tail == pLVar4;
          if (bVar10) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (ulong)i_tail | local_38;
            pLVar4 = i_tail;
          }
          UNLOCK();
          if (bVar10) {
            uVar2 = _Var1 + local_40;
            LOCK();
            i_tail->m_next = uVar2;
            UNLOCK();
            LOCK();
            if (((ulong)i_tail | local_38) == (this->m_tail).super___atomic_base<unsigned_long>._M_i
               ) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = _Var1;
            }
            UNLOCK();
            if (1 < (uint)local_48) {
              density_tests::detail::assert_failed<>
                        ("is_power_of_2(i_alignment)",
                         "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                         ,0x10a);
            }
            __return_storage_ptr__->m_control_block = i_tail;
            __return_storage_ptr__->m_next_ptr = uVar2;
            __return_storage_ptr__->m_user_storage =
                 (void *)((long)&i_tail->m_next + local_58 & local_50);
            cVar5 = '\x01';
            i_tail = pLVar4;
          }
          else {
            cVar5 = '\0';
            i_tail = pLVar4;
          }
        }
        else {
          i_tail = (LfQueueControl *)page_overflow(this,LfQueue_LockFree,(uintptr_t)i_tail);
          if (i_tail == (LfQueueControl *)0x0) goto LAB_00cfb5be;
          cVar5 = '\0';
        }
      }
      else {
        i_address = (ulong *)((ulong)i_tail & 0xffffffffffffffc0);
        PVar3 = PinGuard<density_tests::UnmovableFastTestAllocator<65536UL>,_(density::progress_guarantee)2>
                ::pin(&local_68,i_address);
        pLVar4 = i_tail;
        if (PVar3 != AlreadyPinned) {
          if (PVar3 == PinFailed) {
LAB_00cfb5be:
            __return_storage_ptr__->m_user_storage = (void *)0x0;
            cVar5 = '\x01';
            goto LAB_00cfb5dc;
          }
          pLVar4 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
          if (pLVar4 != i_tail) {
            cVar5 = (pLVar4 != i_tail) * '\x03';
            i_tail = pLVar4;
            goto LAB_00cfb5dc;
          }
        }
        pLVar7 = (LfQueueControl *)
                 ((ulong)(uint)((int)((ulong)i_tail & 0x3f) << 6) + (long)i_address);
        LOCK();
        if (*i_address == 0) {
          *i_address = (ulong)pLVar7 | 1;
        }
        UNLOCK();
        cVar5 = '\0';
        LOCK();
        i_tail = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar10 = pLVar4 == i_tail;
        if (bVar10) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar7;
          i_tail = pLVar4;
        }
        UNLOCK();
        if (bVar10) {
          i_tail = pLVar7;
        }
      }
LAB_00cfb5dc:
    } while ((cVar5 == '\0') || (cVar5 == '\x03'));
  }
  else {
    __return_storage_ptr__->m_user_storage = (void *)0x0;
  }
  if (local_68.m_pinned_page != (void *)0x0) {
    density_tests::UnmovableFastTestAllocator<65536UL>::unpin_page
              (local_68.m_allocator,local_68.m_pinned_page);
  }
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                auto const overhead = i_include_type ? s_element_min_offset : s_rawblock_min_offset;
                auto const required_size = overhead + i_size + (i_alignment - min_alignment);
                auto const required_units =
                  (required_size + (s_alloc_granularity - 1)) / s_alloc_granularity;

                // instantiate a pin-guard - we will use it only in case of contention
                PinGuard<ALLOCATOR_TYPE, ToDenGuarantee(PROGRESS_GUARANTEE)> scoped_pin(this);

                bool const fits_in_page =
                  required_units <
                  size_min(s_alloc_granularity, s_end_control_offset / s_alloc_granularity);
                if (fits_in_page)
                {
                    auto tail = m_tail.load(mem_relaxed);
                    for (;;)
                    {
                        static_assert(is_power_of_2(s_alloc_granularity), "");
                        auto const rest = tail & (s_alloc_granularity - 1);
                        if (rest == 0)
                        {
                            // we can try the allocation
                            auto const new_control = reinterpret_cast<ControlBlock *>(tail);
                            auto const future_tail = tail + required_units * s_alloc_granularity;
                            auto const page_start =
                              uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                            auto const future_tail_offset = future_tail - page_start;
                            auto       transient_tail     = tail + required_units;
                            if (DENSITY_LIKELY(future_tail_offset <= s_end_control_offset))
                            {
                                DENSITY_ASSUME(required_units < s_alloc_granularity);
                                if (m_tail.compare_exchange_weak(tail, transient_tail, mem_relaxed))
                                {
                                    raw_atomic_store(
                                      &new_control->m_next,
                                      future_tail + i_control_bits,
                                      mem_relaxed);

                                    m_tail.compare_exchange_strong(
                                      transient_tail, future_tail, mem_relaxed);

                                    auto const user_storage = address_upper_align(
                                      address_add(new_control, overhead), i_alignment);
                                    DENSITY_ASSUME(
                                      reinterpret_cast<uintptr_t>(user_storage) + i_size <=
                                      future_tail);
                                    return Allocation{
                                      new_control, future_tail + i_control_bits, user_storage};
                                }
                                else
                                {
                                    if (guarantee == LfQueue_WaitFree)
                                    {
                                        return Allocation{};
                                    }
                                }
                            }
                            else
                            {
                                tail = page_overflow(guarantee, tail);

                                if (guarantee != LfQueue_Throwing)
                                {
                                    if (tail == 0)
                                    {
                                        return Allocation{};
                                    }
                                }
                                else
                                {
                                    DENSITY_ASSUME(tail != 0);
                                }
                            }
                        }
                        else
                        {
                            // the memory protection currently used (pinning) is based on an atomic increment, that is not wait-free
                            if (guarantee == LfQueue_WaitFree)
                            {
                                return Allocation{};
                            }

                            // an allocation is in progress, we help it
                            auto const clean_tail = tail - rest;
                            auto const incomplete_control =
                              reinterpret_cast<ControlBlock *>(clean_tail);
                            auto const next = clean_tail + rest * s_alloc_granularity;

                            auto const pin_result = scoped_pin.pin(incomplete_control);
                            if (pin_result != AlreadyPinned)
                            {
                                if (pin_result == PinFailed)
                                {
                                    return Allocation{};
                                }
                                auto updated_tail = m_tail.load(mem_relaxed);
                                if (updated_tail != tail)
                                {
                                    tail = updated_tail;
                                    continue;
                                }
                            }

                            // Note: NEEDS ZEROED-PAGES
                            uintptr_t expected_next = 0;
                            raw_atomic_compare_exchange_weak(
                              &incomplete_control->m_next,
                              &expected_next,
                              uintptr_t(next + LfQueue_Busy),
                              mem_relaxed);
                            if (m_tail.compare_exchange_weak(tail, next, mem_relaxed))
                            {
                                tail = next;
                            }
                        }
                    }
                }
                else
                {
                    // legacy heap allocations can only be blocking
                    if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                        return Allocation{};

                    return Base::template external_allocate<PROGRESS_GUARANTEE>(
                      i_control_bits, i_size, i_alignment);
                }
            }